

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  PositionType PVar3;
  iterator it;
  bool bVar4;
  ReferenceType pSVar5;
  PointerType pSVar6;
  PointerType pSVar7;
  iterator iVar8;
  PositionType pos;
  iterator local_128;
  undefined1 local_118 [232];
  
  this_00 = &originSnapshot.Position;
  it = originSnapshot.Position;
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(this_00);
  SnapshotDataType::SnapshotDataType((SnapshotDataType *)local_118,pSVar5);
  local_128 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  std::__cxx11::string::~string((string *)(local_118 + 0xa8));
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  (pSVar6->ScopeParent).Tree = originSnapshot.Position.Tree;
  (pSVar6->ScopeParent).Position = originSnapshot.Position.Position;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar6->EntryPointLine = entryPointLine;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  std::__cxx11::string::_M_assign((string *)&pSVar6->EntryPointCommand);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar6->SnapshotType = VariableScopeType;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  PVar3 = (pSVar6->Policies).Position;
  (pSVar7->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar7->PolicyScope).Position = PVar3;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  bVar4 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (!bVar4) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x3c6,
                  "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
                 );
  }
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar6->Vars).Tree;
  PVar2 = (pSVar6->Vars).Position;
  iVar8 = pSVar6->Vars;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  (pSVar6->Parent).Tree = pcVar1;
  (pSVar6->Parent).Position = PVar2;
  iVar8 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar8);
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar6->Vars = iVar8;
  pSVar6 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  bVar4 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (bVar4) {
    __return_storage_ptr__->State = this;
    (__return_storage_ptr__->Position).Tree = local_128.Tree;
    (__return_storage_ptr__->Position).Position = local_128.Position;
    return __return_storage_ptr__;
  }
  __assert_fail("pos->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x3cc,
                "cmState::Snapshot cmState::CreateVariableScopeSnapshot(cmState::Snapshot, const std::string &, long)"
               );
}

Assistant:

cmState::Snapshot
cmState::CreateVariableScopeSnapshot(cmState::Snapshot originSnapshot,
                                     std::string const& entryPointCommand,
                                     long entryPointLine)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = VariableScopeType;
  pos->Keep = false;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin =
      originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return cmState::Snapshot(this, pos);
}